

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_HelloRetryRequest_Test::TestBody
          (QUICMethodTest_HelloRetryRequest_Test *this)

{
  int iVar1;
  char *in_R9;
  SSL_QUIC_METHOD quic_method;
  AssertHelper AStack_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string local_58;
  SSL_QUIC_METHOD local_38;
  
  local_38.set_read_secret = QUICMethodTest::SetReadSecretCallback;
  local_38.set_write_secret = QUICMethodTest::SetWriteSecretCallback;
  local_38.add_handshake_data = QUICMethodTest::AddHandshakeDataCallback;
  local_38.flush_flight = QUICMethodTest::FlushFlightCallback;
  local_38.send_alert = QUICMethodTest::SendAlertCallback;
  iVar1 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
  local_68[0] = (internal)(iVar1 != 0);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_68,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1cd5,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
  }
  else {
    iVar1 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
    local_68[0] = (internal)(iVar1 != 0);
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,local_68,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1cd6,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
    }
    else {
      iVar1 = SSL_CTX_set1_groups((this->super_QUICMethodTest).client_ctx_._M_t.
                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                  TestBody::kClientPrefs,2);
      local_68[0] = (internal)(iVar1 != 0);
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_70);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_58,local_68,
                   (AssertionResult *)
                   "SSL_CTX_set1_groups(client_ctx_.get(), kClientPrefs, (sizeof(kClientPrefs) / sizeof((kClientPrefs)[0])))"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1cdc,local_58._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
      }
      else {
        iVar1 = SSL_CTX_set1_groups((this->super_QUICMethodTest).server_ctx_._M_t.
                                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                    TestBody::kServerPrefs,2);
        local_68[0] = (internal)(iVar1 != 0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_58,local_68,
                     (AssertionResult *)
                     "SSL_CTX_set1_groups(server_ctx_.get(), kServerPrefs, (sizeof(kServerPrefs) / sizeof((kServerPrefs)[0])))"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1cdf,local_58._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
        }
        else {
          local_68[0] = (internal)QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest)
          ;
          local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((bool)local_68[0]) {
            local_68[0] = (internal)
                          QUICMethodTest::RunQUICHandshakesAndExpectError
                                    (&this->super_QUICMethodTest,kNoError);
            local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((bool)local_68[0]) {
              QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
              return;
            }
            testing::Message::Message((Message *)&local_70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_58,local_68,(AssertionResult *)"CompleteHandshakesForQUIC()","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1ce2,local_58._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
          }
          else {
            testing::Message::Message((Message *)&local_70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_58,local_68,(AssertionResult *)"CreateClientAndServer()","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1ce1,local_58._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, HelloRetryRequest) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  // BoringSSL predicts the most preferred ECDH group, so using different
  // preferences will trigger HelloRetryRequest.
  static const int kClientPrefs[] = {NID_X25519, NID_X9_62_prime256v1};
  ASSERT_TRUE(SSL_CTX_set1_groups(client_ctx_.get(), kClientPrefs,
                                  OPENSSL_ARRAY_SIZE(kClientPrefs)));
  static const int kServerPrefs[] = {NID_X9_62_prime256v1, NID_X25519};
  ASSERT_TRUE(SSL_CTX_set1_groups(server_ctx_.get(), kServerPrefs,
                                  OPENSSL_ARRAY_SIZE(kServerPrefs)));

  ASSERT_TRUE(CreateClientAndServer());
  ASSERT_TRUE(CompleteHandshakesForQUIC());
  ExpectHandshakeSuccess();
}